

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O2

void __thiscall Assimp::STLExporter::WriteMesh(STLExporter *this,aiMesh *m)

{
  uint uVar1;
  aiVector3D *paVar2;
  string *psVar3;
  STLExporter *pSVar4;
  ostream *poVar5;
  uint a;
  ulong uVar6;
  aiFace *paVar7;
  uint a_1;
  float fVar8;
  float fVar9;
  aiVector3t<float> local_58;
  string *local_48;
  STLExporter *local_40;
  ulong local_38;
  
  local_48 = (string *)&this->endl;
  local_40 = this;
  for (local_38 = 0; local_38 < m->mNumFaces; local_38 = local_38 + 1) {
    paVar7 = m->mFaces + local_38;
    local_58.x = 0.0;
    local_58.y = 0.0;
    local_58.z = 0.0;
    paVar2 = m->mNormals;
    if (paVar2 != (aiVector3D *)0x0) {
      fVar8 = 0.0;
      fVar9 = 0.0;
      for (uVar6 = 0; uVar6 < paVar7->mNumIndices; uVar6 = uVar6 + 1) {
        uVar1 = paVar7->mIndices[uVar6];
        fVar9 = fVar9 + paVar2[uVar1].x;
        fVar8 = fVar8 + paVar2[uVar1].y;
        local_58.y = fVar8;
        local_58.x = fVar9;
        local_58.z = local_58.z + paVar2[uVar1].z;
      }
      aiVector3t<float>::NormalizeSafe(&local_58);
    }
    pSVar4 = local_40;
    poVar5 = std::operator<<((ostream *)local_40," facet normal ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_58.x);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_58.y);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_58.z);
    psVar3 = local_48;
    std::operator<<(poVar5,local_48);
    poVar5 = std::operator<<((ostream *)pSVar4,"  outer loop");
    std::operator<<(poVar5,psVar3);
    for (uVar6 = 0; pSVar4 = local_40, uVar6 < paVar7->mNumIndices; uVar6 = uVar6 + 1) {
      paVar2 = m->mVertices;
      uVar1 = paVar7->mIndices[uVar6];
      poVar5 = std::operator<<((ostream *)local_40,"  vertex ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar2[uVar1].x);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar2[uVar1].y);
      poVar5 = std::operator<<(poVar5," ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar2[uVar1].z);
      std::operator<<(poVar5,local_48);
    }
    poVar5 = std::operator<<((ostream *)local_40,"  endloop");
    psVar3 = local_48;
    std::operator<<(poVar5,local_48);
    poVar5 = std::operator<<((ostream *)pSVar4," endfacet");
    poVar5 = std::operator<<(poVar5,psVar3);
    std::operator<<(poVar5,psVar3);
  }
  return;
}

Assistant:

void STLExporter::WriteMesh(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.NormalizeSafe();
        }
        mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
        mOutput << "  outer loop" << endl;
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }

        mOutput << "  endloop" << endl;
        mOutput << " endfacet" << endl << endl;
    }
}